

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_printf.h
# Opt level: O1

int stbsp__real_to_str(char **start,uint *len,char *out,int *decimal_pos,double value,
                      uint frac_digits)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  ulong *puVar15;
  int iVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  uVar1 = (uint)((ulong)value >> 0x20);
  uVar6 = uVar1 >> 0x14 & 0x7ff;
  if (((ulong)value >> 0x34 & 0x7ff) == 0) {
    if ((value == 0.0) && (!NAN(value))) {
      *decimal_pos = 1;
      *start = out;
      *out = '0';
      uVar6 = 1;
      goto LAB_0010aa9b;
    }
    uVar6 = 0;
    if (((ulong)value >> 0x33 & 1) == 0) {
      uVar12 = 0x8000000000000;
      uVar6 = 0;
      do {
        uVar6 = uVar6 - 1;
        uVar12 = uVar12 >> 1;
      } while ((uVar12 & (ulong)value) == 0);
    }
  }
  else if (uVar6 == 0x7ff) {
    pcVar14 = "NaN";
    if (((ulong)value & 0xfffffffffffff) == 0) {
      pcVar14 = "Inf";
    }
    *start = pcVar14;
    *decimal_pos = 0x7000;
    uVar6 = 3;
    goto LAB_0010aa9b;
  }
  dVar20 = ABS(value);
  if ((int)uVar6 < 0x3ff) {
    iVar7 = (uVar6 - 0x3ff) * 0x269;
    iVar16 = iVar7 + 0x7ff;
    if (-1 < iVar7) {
      iVar16 = iVar7;
    }
    iVar16 = iVar16 >> 0xb;
  }
  else {
    iVar16 = ((uVar6 - 0x3ff) * 0x4d1 >> 0xc) + 1;
  }
  uVar6 = 0x12 - iVar16;
  if (uVar6 < 0x17) {
    dVar17 = stbsp__bot[uVar6];
    dVar18 = dVar20 * dVar17;
    dVar4 = (double)((ulong)dVar20 & 0x7ffffffff8000000);
    dVar3 = (double)((ulong)dVar17 & 0xfffffffff8000000);
    dVar17 = (dVar17 - dVar3) * (dVar20 - dVar4) +
             dVar3 * (dVar20 - dVar4) + dVar4 * (dVar17 - dVar3) + (dVar4 * dVar3 - dVar18);
  }
  else {
    uVar9 = -uVar6;
    if (0 < (int)uVar6) {
      uVar9 = uVar6;
    }
    uVar8 = uVar9 * 0x2c9 >> 0xe;
    uVar6 = 0xd;
    if (uVar8 < 0xd) {
      uVar6 = uVar8;
    }
    iVar7 = uVar6 * -0x17 + uVar9;
    dVar18 = dVar20;
    if (iVar16 < 0x13) {
      if (iVar7 == 0) {
        dVar17 = 0.0;
      }
      else {
        iVar10 = 0x16;
        if (iVar7 < 0x16) {
          iVar10 = iVar7;
        }
        dVar17 = stbsp__bot[iVar10];
        dVar18 = dVar20 * dVar17;
        dVar4 = (double)((ulong)dVar20 & 0x7ffffffff8000000);
        dVar3 = (double)((ulong)dVar17 & 0xfffffffff8000000);
        dVar17 = (dVar17 - dVar3) * (dVar20 - dVar4) +
                 dVar3 * (dVar20 - dVar4) + dVar4 * (dVar17 - dVar3) + (dVar4 * dVar3 - dVar18);
        if (0x16 < iVar7) {
          dVar19 = dVar18 + dVar17;
          dVar20 = stbsp__bot[iVar7 - iVar10];
          dVar3 = (double)((ulong)dVar19 & 0xfffffffff8000000);
          dVar4 = (double)((ulong)dVar20 & 0xfffffffff8000000);
          dVar17 = (dVar17 - (dVar19 - dVar18)) * dVar20 +
                   (dVar20 - dVar4) * (dVar19 - dVar3) +
                   dVar4 * (dVar19 - dVar3) +
                   dVar3 * (dVar20 - dVar4) + (dVar3 * dVar4 - dVar19 * dVar20);
          dVar18 = dVar19 * dVar20;
        }
      }
      if (0x16 < uVar9) {
        dVar19 = dVar18 + dVar17;
        dVar20 = *(double *)(&DAT_0010e748 + (ulong)uVar6 * 8);
        dVar21 = dVar19 - dVar18;
        dVar3 = (double)((ulong)dVar19 & 0xfffffffff8000000);
        dVar4 = (double)((ulong)dVar20 & 0xfffffffff8000000);
        dVar18 = dVar19 * dVar20;
        dVar17 = (dVar17 - dVar21) * dVar20;
        dVar21 = dVar4 * (dVar19 - dVar3) + dVar3 * (dVar20 - dVar4) + (dVar3 * dVar4 - dVar18);
        dVar20 = (dVar20 - dVar4) * (dVar19 - dVar3);
        pdVar5 = stbsp__toperr;
        goto LAB_0010a819;
      }
    }
    else {
      if (iVar7 == 0) {
        dVar17 = 0.0;
      }
      else {
        dVar18 = *(double *)(&DAT_0010e508 + (long)iVar7 * 8);
        dVar3 = (double)((ulong)dVar20 & 0x7ffffffff8000000);
        dVar17 = (double)((ulong)dVar18 & 0xfffffffff8000000);
        dVar17 = stbsp__negbot[(long)iVar7 + 0x15] * dVar20 +
                 (dVar18 - dVar17) * (dVar20 - dVar3) +
                 dVar17 * (dVar20 - dVar3) +
                 dVar3 * (dVar18 - dVar17) + (dVar3 * dVar17 - dVar20 * dVar18);
        dVar18 = dVar20 * dVar18;
      }
      if (0x16 < uVar9) {
        dVar19 = dVar18 + dVar17;
        dVar20 = stbsp__negboterr[(ulong)uVar6 + 0x15];
        dVar21 = dVar19 - dVar18;
        dVar3 = (double)((ulong)dVar19 & 0xfffffffff8000000);
        dVar4 = (double)((ulong)dVar20 & 0xfffffffff8000000);
        dVar18 = dVar19 * dVar20;
        dVar17 = (dVar17 - dVar21) * dVar20;
        dVar21 = dVar4 * (dVar19 - dVar3) + dVar3 * (dVar20 - dVar4) + (dVar3 * dVar4 - dVar18);
        dVar20 = (dVar20 - dVar4) * (dVar19 - dVar3);
        pdVar5 = stbsp__negtoperr;
LAB_0010a819:
        dVar17 = dVar19 * pdVar5[(ulong)uVar6 - 1] + dVar17 + dVar20 + dVar21;
      }
    }
  }
  dVar3 = dVar18 + dVar17;
  dVar20 = (double)(long)dVar3;
  dVar4 = dVar3 - dVar20;
  uVar12 = (long)(((dVar3 - (dVar4 - (dVar4 - dVar3))) - ((dVar4 - dVar3) + dVar20)) + dVar4 +
                 (dVar17 - (dVar3 - dVar18))) + (long)dVar3;
  iVar16 = iVar16 + (uint)(999999999999999999 < uVar12);
  uVar6 = iVar16 + frac_digits;
  if ((int)frac_digits < 0) {
    uVar6 = (frac_digits & 0x7ffffff) + 1;
  }
  if (uVar6 < 0x18) {
    uVar9 = (uint)(999999999 < uVar12) * 9;
    puVar15 = stbsp__powten + uVar9;
    uVar9 = ~uVar9;
    do {
      puVar15 = puVar15 + 1;
      if (uVar12 < *puVar15) {
        if ((uVar6 < -uVar9) && (-(uVar6 + uVar9) < 0x18)) {
          uVar12 = (stbsp__powten[-(uVar6 + uVar9)] >> 1) + uVar12;
          iVar16 = (iVar16 + 1) - (uint)(uVar12 < *puVar15);
          uVar12 = uVar12 / stbsp__powten[-(uVar6 + uVar9)];
        }
        break;
      }
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0xffffffec);
  }
  uVar13 = uVar12;
  if (uVar12 != 0) {
    if (0xffffffff < (long)uVar12) {
      do {
        if (0x4189374bc6a7ef <
            (uVar13 * 0x1cac083126e978d5 >> 3 | uVar13 * 0x1cac083126e978d5 << 0x3d))
        goto LAB_0010a9b7;
        uVar12 = uVar13 / 1000;
        uVar2 = uVar13 >> 0x23;
        uVar13 = uVar12;
      } while (0x7c < (uint)uVar2);
    }
    uVar6 = (uint)((int)uVar12 * 0x26e978d5) >> 3 | (int)uVar12 * -0x60000000;
    while (uVar6 < 0x418938) {
      uVar13 = uVar12 & 0xffffffff;
      uVar12 = uVar13 / 1000;
      iVar7 = (int)(uVar13 / 1000);
      uVar6 = (uint)(iVar7 * 0x26e978d5) >> 3 | iVar7 * -0x60000000;
    }
    uVar13 = uVar12 & 0xffffffff;
  }
LAB_0010a9b7:
  pcVar14 = out + 0x40;
  uVar6 = 0;
  do {
    if ((long)uVar13 < 100000000) {
      uVar12 = 0;
    }
    else {
      uVar12 = uVar13 / 100000000;
      uVar13 = uVar13 % 100000000;
    }
    lVar11 = 0;
    if ((int)uVar13 != 0) {
      do {
        uVar9 = (uint)uVar13;
        uVar13 = (uVar13 & 0xffffffff) / 100;
        *(undefined2 *)(pcVar14 + lVar11 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (ulong)(uVar9 + (int)uVar13 * -100) * 2);
        lVar11 = lVar11 + -2;
      } while (99 < uVar9);
      uVar6 = uVar6 - (int)lVar11;
    }
    if (uVar12 == 0) {
      pcVar14 = pcVar14 + lVar11;
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else if (*pcVar14 == '0') {
        pcVar14 = pcVar14 + 1;
        uVar6 = uVar6 - 1;
      }
    }
    else {
      if (lVar11 != -8) {
        memset(pcVar14 + -8,0x30,lVar11 + 8);
        uVar6 = uVar6 + (int)lVar11 + 8;
        lVar11 = -8;
      }
      pcVar14 = pcVar14 + lVar11;
    }
    uVar13 = uVar12;
  } while (uVar12 != 0);
  *decimal_pos = iVar16;
  *start = pcVar14;
LAB_0010aa9b:
  *len = uVar6;
  return (int)uVar1 >> 0x1f;
}

Assistant:

static stbsp__int32 stbsp__real_to_str(char const **start, stbsp__uint32 *len, char *out, stbsp__int32 *decimal_pos, double value, stbsp__uint32 frac_digits)
{
   double d;
   stbsp__int64 bits = 0;
   stbsp__int32 expo, e, ng, tens;

   d = value;
   STBSP__COPYFP(bits, d);
   expo = (stbsp__int32)((bits >> 52) & 2047);
   ng = (stbsp__int32)(bits >> 63);
   if (ng)
      d = -d;

   if (expo == 2047) // is nan or inf?
   {
      *start = (bits & ((((stbsp__uint64)1) << 52) - 1)) ? "NaN" : "Inf";
      *decimal_pos = STBSP__SPECIAL;
      *len = 3;
      return ng;
   }

   if (expo == 0) // is zero or denormal
   {
      if ((bits << 1) == 0) // do zero
      {
         *decimal_pos = 1;
         *start = out;
         out[0] = '0';
         *len = 1;
         return ng;
      }
      // find the right expo for denormals
      {
         stbsp__int64 v = ((stbsp__uint64)1) << 51;
         while ((bits & v) == 0) {
            --expo;
            v >>= 1;
         }
      }
   }

   // find the decimal exponent as well as the decimal bits of the value
   {
      double ph, pl;

      // log10 estimate - very specifically tweaked to hit or undershoot by no more than 1 of log10 of all expos 1..2046
      tens = expo - 1023;
      tens = (tens < 0) ? ((tens * 617) / 2048) : (((tens * 1233) / 4096) + 1);

      // move the significant bits into position and stick them into an int
      stbsp__raise_to_power10(&ph, &pl, d, 18 - tens);

      // get full as much precision from double-double as possible
      stbsp__ddtoS64(bits, ph, pl);

      // check if we undershot
      if (((stbsp__uint64)bits) >= stbsp__tento19th)
         ++tens;
   }

   // now do the rounding in integer land
   frac_digits = (frac_digits & 0x80000000) ? ((frac_digits & 0x7ffffff) + 1) : (tens + frac_digits);
   if ((frac_digits < 24)) {
      stbsp__uint32 dg = 1;
      if ((stbsp__uint64)bits >= stbsp__powten[9])
         dg = 10;
      while ((stbsp__uint64)bits >= stbsp__powten[dg]) {
         ++dg;
         if (dg == 20)
            goto noround;
      }
      if (frac_digits < dg) {
         stbsp__uint64 r;
         // add 0.5 at the right position and round
         e = dg - frac_digits;
         if ((stbsp__uint32)e >= 24)
            goto noround;
         r = stbsp__powten[e];
         bits = bits + (r / 2);
         if ((stbsp__uint64)bits >= stbsp__powten[dg])
            ++tens;
         bits /= r;
      }
   noround:;
   }

   // kill long trailing runs of zeros
   if (bits) {
      stbsp__uint32 n;
      for (;;) {
         if (bits <= 0xffffffff)
            break;
         if (bits % 1000)
            goto donez;
         bits /= 1000;
      }
      n = (stbsp__uint32)bits;
      while ((n % 1000) == 0)
         n /= 1000;
      bits = n;
   donez:;
   }

   // convert to string
   out += 64;
   e = 0;
   for (;;) {
      stbsp__uint32 n;
      char *o = out - 8;
      // do the conversion in chunks of U32s (avoid most 64-bit divides, worth it, constant denomiators be damned)
      if (bits >= 100000000) {
         n = (stbsp__uint32)(bits % 100000000);
         bits /= 100000000;
      } else {
         n = (stbsp__uint32)bits;
         bits = 0;
      }
      while (n) {
         out -= 2;
         *(stbsp__uint16 *)out = *(stbsp__uint16 *)&stbsp__digitpair[(n % 100) * 2];
         n /= 100;
         e += 2;
      }
      if (bits == 0) {
         if ((e) && (out[0] == '0')) {
            ++out;
            --e;
         }
         break;
      }
      while (out != o) {
         *--out = '0';
         ++e;
      }
   }

   *decimal_pos = tens;
   *start = out;
   *len = e;
   return ng;
}